

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int tcptran_dialer_init(void *arg,nng_url *url,nni_dialer *ndialer)

{
  int iVar1;
  nni_sock *sock_00;
  size_t sVar2;
  nni_sock *sock;
  int rv;
  tcptran_ep *ep;
  nni_dialer *ndialer_local;
  nng_url *url_local;
  void *arg_local;
  
  sock_00 = nni_dialer_sock(ndialer);
  *(nni_dialer **)((long)arg + 0x428) = ndialer;
  tcptran_ep_init((tcptran_ep *)arg,sock_00,tcptran_dial_cb);
  sVar2 = strlen(url->u_path);
  if ((sVar2 == 0) || (iVar1 = strcmp(url->u_path,"/"), iVar1 == 0)) {
    if ((((url->u_fragment == (char *)0x0) && (url->u_userinfo == (char *)0x0)) &&
        (url->u_query == (char *)0x0)) &&
       ((sVar2 = strlen(url->u_hostname), sVar2 != 0 && (url->u_port != 0)))) {
      arg_local._4_4_ = nng_stream_dialer_alloc_url((nng_stream_dialer **)((long)arg + 0x410),url);
      if (arg_local._4_4_ == 0) {
        nni_dialer_add_stat(ndialer,(nni_stat_item *)((long)arg + 0x430));
        arg_local._4_4_ = 0;
      }
    }
    else {
      arg_local._4_4_ = 0xf;
    }
  }
  else {
    arg_local._4_4_ = 0xf;
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcptran_dialer_init(void *arg, nng_url *url, nni_dialer *ndialer)
{
	tcptran_ep *ep = arg;
	int         rv;
	nni_sock   *sock = nni_dialer_sock(ndialer);

	ep->ndialer = ndialer;
	tcptran_ep_init(ep, sock, tcptran_dial_cb);

	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL) || (strlen(url->u_hostname) == 0) ||
	    (url->u_port == 0)) {
		return (NNG_EADDRINVAL);
	}

	if ((rv = nng_stream_dialer_alloc_url(&ep->dialer, url)) != 0) {
		return (rv);
	}

#ifdef NNG_ENABLE_STATS
	nni_dialer_add_stat(ndialer, &ep->st_rcv_max);
#endif
	return (0);
}